

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

void __thiscall Bipartition::complement(Bipartition *this,size_t numLeaves)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  size_t i;
  size_t s;
  reference in_stack_ffffffffffffffd0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  
  size((Bipartition *)0x15c10c);
  for (this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      this_00 < in_RSI;
      this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)&(this_00->m_bits).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    in_stack_ffffffffffffffd0 =
         boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                   (this_00,in_stack_ffffffffffffffd0.m_mask);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::flip
              ((reference *)in_stack_ffffffffffffffd0.m_block);
  }
  return;
}

Assistant:

void Bipartition::complement(size_t numLeaves) {
    size_t s = size();
    for (size_t i = 0; i < numLeaves; ++i) {
        partition[s - i - 1].flip();
    }
}